

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O0

void __thiscall tinyusdz::Path::Path(Path *this,string *p,string *prop)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  difference_type dVar8;
  size_type sVar9;
  string *psVar10;
  difference_type dVar11;
  string local_198 [40];
  undefined8 local_170;
  undefined8 local_168;
  string local_160 [8];
  string prop_name_1;
  size_type loc_1;
  difference_type ndots_1;
  string local_f8 [8];
  string prop_name;
  size_type loc;
  difference_type ndots;
  string local_a8 [32];
  uint local_88;
  undefined8 local_80;
  undefined8 local_78;
  difference_type local_70;
  difference_type nslashes;
  string local_60;
  undefined1 local_40 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  prims;
  anon_class_1_0_00000001_for__M_pred dot_fun;
  anon_class_1_0_00000001_for__M_pred slash_fun;
  string *prop_local;
  string *p_local;
  Path *this_local;
  
  ::std::__cxx11::string::string((string *)this);
  ::std::__cxx11::string::string((string *)&this->_prop_part);
  ::std::__cxx11::string::string((string *)&this->_variant_part);
  ::std::__cxx11::string::string((string *)&this->_variant_selection_part);
  ::std::__cxx11::string::string((string *)&this->_variant_part_str);
  ::std::__cxx11::string::string((string *)&this->_element);
  nonstd::optional_lite::optional<tinyusdz::Path::PathType>::optional(&this->_path_type);
  this->_valid = false;
  uVar3 = ::std::__cxx11::string::empty();
  if (((uVar3 & 1) != 0) && (uVar3 = ::std::__cxx11::string::empty(), (uVar3 & 1) != 0)) {
    this->_valid = false;
    return;
  }
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_60,"/",(allocator *)((long)&nslashes + 7));
  iVar2 = ::std::numeric_limits<int>::max();
  split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_40,p,&local_60,iVar2 / 100);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::allocator<char>::~allocator((allocator<char> *)((long)&nslashes + 7));
  lVar4 = ::std::__cxx11::string::size();
  if (lVar4 != 0) {
    local_78 = ::std::__cxx11::string::begin();
    local_80 = ::std::__cxx11::string::end();
    local_70 = ::std::
               count_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,tinyusdz::Path::Path(std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                         (local_78,local_80);
    if (local_70 != 0) {
      this->_valid = false;
      local_88 = 1;
      goto LAB_00386ce7;
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_a8,".",(allocator *)((long)&ndots + 7));
    bVar1 = startsWith((string *)prop,(string *)local_a8);
    ::std::__cxx11::string::~string(local_a8);
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&ndots + 7));
    if (bVar1) {
      this->_valid = false;
      local_88 = 1;
      goto LAB_00386ce7;
    }
  }
  pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)p);
  if (*pcVar5 == '/') {
    uVar6 = ::std::__cxx11::string::begin();
    uVar7 = ::std::__cxx11::string::end();
    dVar8 = ::std::
            count_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,tinyusdz::Path::Path(std::__cxx11::string_const&,std::__cxx11::string_const&)::__1>
                      (uVar6,uVar7);
    if (dVar8 == 0) {
      ::std::__cxx11::string::operator=((string *)this,(string *)p);
      lVar4 = ::std::__cxx11::string::size();
      if (lVar4 == 0) {
        sVar9 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_40);
        if (sVar9 == 0) {
          ::std::__cxx11::string::operator=((string *)&this->_element,(string *)p);
        }
        else {
          sVar9 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_40);
          psVar10 = (string *)
                    ::std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_40,sVar9 - 1);
          ::std::__cxx11::string::operator=((string *)&this->_element,psVar10);
        }
      }
      else {
        ::std::__cxx11::string::operator=((string *)&this->_prop_part,(string *)prop);
        ::std::__cxx11::string::operator=((string *)&this->_element,(string *)prop);
      }
      this->_valid = true;
    }
    else {
      if (dVar8 != 1) {
        this->_valid = false;
        local_88 = 1;
        goto LAB_00386ce7;
      }
      lVar4 = ::std::__cxx11::string::size();
      if (lVar4 != 0) {
        this->_valid = false;
        local_88 = 1;
        goto LAB_00386ce7;
      }
      uVar3 = ::std::__cxx11::string::size();
      if (uVar3 < 3) {
        this->_valid = false;
        local_88 = 1;
        goto LAB_00386ce7;
      }
      prop_name.field_2._8_8_ = ::std::__cxx11::string::find_first_of((char)p,0x2e);
      if (prop_name.field_2._8_8_ == -1) {
        this->_valid = false;
        local_88 = 1;
        goto LAB_00386ce7;
      }
      if (prop_name.field_2._8_8_ == 0) {
        this->_valid = false;
      }
      ::std::__cxx11::string::substr((ulong)local_f8,(ulong)p);
      psVar10 = (string *)::std::__cxx11::string::erase((ulong)local_f8,0);
      ::std::__cxx11::string::operator=((string *)&this->_prop_part,psVar10);
      ::std::__cxx11::string::substr((ulong)&ndots_1,(ulong)p);
      ::std::__cxx11::string::operator=((string *)this,(string *)&ndots_1);
      ::std::__cxx11::string::~string((string *)&ndots_1);
      ::std::__cxx11::string::operator=((string *)&this->_element,(string *)&this->_prop_part);
      this->_valid = true;
      ::std::__cxx11::string::~string(local_f8);
    }
  }
  else {
    pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)p);
    if (*pcVar5 == '.') {
      ::std::__cxx11::string::operator=((string *)this,(string *)p);
      lVar4 = ::std::__cxx11::string::size();
      if (lVar4 == 0) {
        sVar9 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_40);
        if (sVar9 == 0) {
          ::std::__cxx11::string::operator=((string *)&this->_element,(string *)p);
        }
        else {
          sVar9 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_40);
          psVar10 = (string *)
                    ::std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_40,sVar9 - 1);
          ::std::__cxx11::string::operator=((string *)&this->_element,psVar10);
        }
      }
      else {
        ::std::__cxx11::string::operator=((string *)&this->_prop_part,(string *)prop);
        ::std::__cxx11::string::operator=((string *)&this->_element,(string *)prop);
      }
      this->_valid = true;
    }
    else {
      uVar6 = ::std::__cxx11::string::begin();
      uVar7 = ::std::__cxx11::string::end();
      dVar8 = ::std::
              count_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,tinyusdz::Path::Path(std::__cxx11::string_const&,std::__cxx11::string_const&)::__1>
                        (uVar6,uVar7);
      if (dVar8 == 0) {
        ::std::__cxx11::string::operator=((string *)this,(string *)p);
        lVar4 = ::std::__cxx11::string::size();
        if (lVar4 != 0) {
          ::std::__cxx11::string::operator=((string *)&this->_prop_part,(string *)prop);
        }
        this->_valid = true;
      }
      else {
        if (dVar8 != 1) {
          this->_valid = false;
          local_88 = 1;
          goto LAB_00386ce7;
        }
        uVar3 = ::std::__cxx11::string::size();
        if (uVar3 < 3) {
          this->_valid = false;
          local_88 = 1;
          goto LAB_00386ce7;
        }
        prop_name_1.field_2._8_8_ = ::std::__cxx11::string::find_first_of((char)p,0x2e);
        if (prop_name_1.field_2._8_8_ == -1) {
          this->_valid = false;
          local_88 = 1;
          goto LAB_00386ce7;
        }
        if (prop_name_1.field_2._8_8_ == 0) {
          this->_valid = false;
        }
        ::std::__cxx11::string::substr((ulong)local_160,(ulong)p);
        local_168 = ::std::__cxx11::string::begin();
        local_170 = ::std::__cxx11::string::end();
        dVar11 = ::std::
                 count_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,tinyusdz::Path::Path(std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                           (local_168,local_170);
        if (dVar11 < 1) {
          ::std::__cxx11::string::substr((ulong)local_198,(ulong)p);
          ::std::__cxx11::string::operator=((string *)this,local_198);
          ::std::__cxx11::string::~string(local_198);
          psVar10 = (string *)::std::__cxx11::string::erase((ulong)local_160,0);
          ::std::__cxx11::string::operator=((string *)&this->_prop_part,psVar10);
          this->_valid = true;
        }
        else {
          this->_valid = false;
        }
        local_88 = (uint)(dVar11 >= 1);
        ::std::__cxx11::string::~string(local_160);
        if (local_88 != 0) goto LAB_00386ce7;
      }
    }
  }
  local_88 = 0;
LAB_00386ce7:
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_40);
  return;
}

Assistant:

Path::Path(const std::string &p, const std::string &prop) {
  //
  // For absolute path, starts with '/' and no other '/' exists.
  // For property part, '.' exists only once.
  //

  if (p.empty() && prop.empty()) {
    _valid = false;
    return;
  }

  auto slash_fun = [](const char c) { return c == '/'; };
  auto dot_fun = [](const char c) { return c == '.'; };

  std::vector<std::string> prims = split(p, "/");

  // TODO: More checks('{', '[', ...)

  if (prop.size()) {
    // prop should not contain slashes
    auto nslashes = std::count_if(prop.begin(), prop.end(), slash_fun);
    if (nslashes) {
      _valid = false;
      return;
    }

    // prop does not start with '.'
    if (startsWith(prop, ".")) {
      _valid = false;
      return;
    }
  }

  if (p[0] == '/') {
    // absolute path

    auto ndots = std::count_if(p.begin(), p.end(), dot_fun);

    if (ndots == 0) {
      // absolute prim.
      _prim_part = p;

      if (prop.size()) {
        _prop_part = prop;
        _element = prop;
      } else {
        if (prims.size()) {
          _element = prims[prims.size() - 1];
        } else {
          _element = p;
        }
      }
      _valid = true;
    } else if (ndots == 1) {
      // prim_part contains property name.
      if (prop.size()) {
        // prop must be empty.
        _valid = false;
        return;
      }

      if (p.size() < 3) {
        // "/."
        _valid = false;
        return;
      }

      auto loc = p.find_first_of('.');
      if (loc == std::string::npos) {
        // ?
        _valid = false;
        return;
      }

      if (loc <= 0) {
        // this should not happen though.
        _valid = false;
      }

      // split
      std::string prop_name = p.substr(size_t(loc));

      _prop_part = prop_name.erase(0, 1);  // remove '.'
      _prim_part = p.substr(0, size_t(loc));
      _element = _prop_part;  // elementName is property path

      _valid = true;

    } else {
      _valid = false;
      return;
    }

  } else if (p[0] == '.') {
    // maybe relative(e.g. "./xform", "../xform")
    // FIXME: Support relative path fully

#if 0
    auto nslashes = std::count_if(p.begin(), p.end(), slash_fun);
    if (nslashes > 0) {
      _valid = false;
      return;
    }

    _prop_part = p;
    _prop_part = _prop_part.erase(0, 1);
    _valid = true;
#else
    _prim_part = p;
    if (prop.size()) {
      _prop_part = prop;
      _element = prop;
    } else {
      if (prims.size()) {
        _element = prims[prims.size() - 1];
      } else {
        _element = p;
      }
    }
    _valid = true;

#endif

  } else {
    // prim.prop

    auto ndots = std::count_if(p.begin(), p.end(), dot_fun);
    if (ndots == 0) {
      // relative prim.
      _prim_part = p;
      if (prop.size()) {
        _prop_part = prop;
      }
      _valid = true;
    } else if (ndots == 1) {
      if (p.size() < 3) {
        // "/."
        _valid = false;
        return;
      }

      auto loc = p.find_first_of('.');
      if (loc == std::string::npos) {
        // ?
        _valid = false;
        return;
      }

      if (loc <= 0) {
        // this should not happen though.
        _valid = false;
      }

      // split
      std::string prop_name = p.substr(size_t(loc));

      // Check if No '/' in prop_part
      if (std::count_if(prop_name.begin(), prop_name.end(), slash_fun) > 0) {
        _valid = false;
        return;
      }

      _prim_part = p.substr(0, size_t(loc));
      _prop_part = prop_name.erase(0, 1);  // remove '.'

      _valid = true;

    } else {
      _valid = false;
      return;
    }
  }
}